

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpuProcessImage.h
# Opt level: O2

void __thiscall
gpu::ImageProcessing<unsigned_char>::applyConvolution
          (ImageProcessing<unsigned_char> *this,uchar *inputBuffer,uchar *outputBuffer,int *kernel,
          int imageWidth,int imageHeight,int spectrum,int kernelSize,int normal)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int channel;
  int j;
  int iVar5;
  int offset;
  int iVar6;
  bool bVar7;
  
  iVar2 = 0;
  iVar3 = 0;
  if (0 < imageHeight) {
    iVar3 = imageHeight;
  }
  iVar4 = 0;
  if (0 < imageWidth) {
    iVar4 = imageWidth;
  }
  if (spectrum < 1) {
    spectrum = 0;
  }
  for (channel = 0; channel != spectrum; channel = channel + 1) {
    iVar5 = 0;
    iVar1 = iVar2;
    while( true ) {
      iVar6 = iVar3;
      offset = iVar1;
      if (iVar5 == iVar4) break;
      while( true ) {
        bVar7 = iVar6 == 0;
        iVar6 = iVar6 + -1;
        if (bVar7) break;
        ConvolutionFilters<unsigned_char>::applyConvolution
                  ((ConvolutionFilters<unsigned_char> *)&this->field_0x10,inputBuffer,outputBuffer,
                   kernel,imageWidth,imageHeight,kernelSize,normal,offset,channel);
        offset = offset + imageWidth;
      }
      iVar5 = iVar5 + 1;
      iVar1 = iVar1 + 1;
    }
    iVar2 = iVar2 + imageHeight * imageWidth;
  }
  return;
}

Assistant:

void ImageProcessing<T>::applyConvolution(T *inputBuffer, 
                                              T *outputBuffer, 
                                              int *kernel, 
                                              int imageWidth,
                                              int imageHeight, 
                                              int spectrum,
                                              int kernelSize,
                                              int normal)                                   
    {


      for(int channel = 0; channel < spectrum ; ++channel)
      {
        for(int j = 0; j < imageWidth; ++j)
        {
          for(int i = 0; i < imageHeight; ++i)
          {
            int offset = channel*imageWidth*imageHeight +  i * imageWidth + j;
            convolutionFilter.applyConvolution(inputBuffer,outputBuffer,kernel,imageWidth,imageHeight,kernelSize,normal,offset,channel);
          }
        }
      }
    }